

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O3

void __thiscall Messages::Person::InternalSwap(Person *this,Person *other)

{
  ArenaStringPtr *pAVar1;
  ArenaStringPtr *pAVar2;
  uint32 uVar3;
  int32 iVar4;
  ulong uVar5;
  string *psVar6;
  UnknownFieldSet *other_00;
  Arena *arena;
  Arena *arena_00;
  
  uVar5 = *(ulong *)&other->field_0x8;
  if ((this->field_0x8 & 1) == 0) {
    if ((uVar5 & 1) != 0) {
LAB_0010934d:
      other_00 = (UnknownFieldSet *)((uVar5 & 0xfffffffffffffffe) + 8);
      goto LAB_00109355;
    }
  }
  else {
    if ((uVar5 & 1) != 0) goto LAB_0010934d;
    other_00 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         ((InternalMetadata *)&other->field_0x8);
LAB_00109355:
    google::protobuf::internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8,other_00);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->phones_).super_RepeatedPtrFieldBase,
             &(other->phones_).super_RepeatedPtrFieldBase);
  pAVar1 = &this->name_;
  arena_00 = *(Arena **)&this->field_0x8;
  uVar5 = (ulong)arena_00 & 1;
  arena = arena_00;
  if (uVar5 != 0) {
    arena = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  pAVar2 = &other->name_;
  psVar6 = pAVar1->ptr_;
  if (psVar6 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) {
      google::protobuf::internal::ArenaStringPtr::CreateInstance
                (pAVar1,arena,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      psVar6 = pAVar1->ptr_;
      goto LAB_001093cc;
    }
  }
  else {
LAB_001093cc:
    if (pAVar2->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) {
      google::protobuf::internal::ArenaStringPtr::CreateInstance
                (pAVar2,arena,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar6);
    arena_00 = *(Arena **)&this->field_0x8;
    uVar5 = (ulong)((uint)arena_00 & 1);
  }
  pAVar1 = &this->email_;
  if (uVar5 != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  pAVar2 = &other->email_;
  psVar6 = pAVar1->ptr_;
  if (psVar6 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar2->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) goto LAB_0010946d;
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (pAVar1,arena_00,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
    psVar6 = pAVar1->ptr_;
  }
  if (pAVar2->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
  {
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (pAVar2,arena_00,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar6);
LAB_0010946d:
  iVar4 = this->id_;
  this->id_ = other->id_;
  other->id_ = iVar4;
  return;
}

Assistant:

void Person::InternalSwap(Person* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  phones_.InternalSwap(&other->phones_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  email_.Swap(&other->email_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(id_, other->id_);
}